

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O1

uint8_t winmd::reader::database::
        composite_index_size<winmd::reader::table<winmd::reader::MethodDef>,winmd::reader::table<winmd::reader::Field>,winmd::reader::table<winmd::reader::TypeRef>,winmd::reader::table<winmd::reader::TypeDef>,winmd::reader::table<winmd::reader::Param>,winmd::reader::table<winmd::reader::InterfaceImpl>,winmd::reader::table<winmd::reader::MemberRef>,winmd::reader::table<winmd::reader::Module>,winmd::reader::table<winmd::reader::Property>,winmd::reader::table<winmd::reader::Event>,winmd::reader::table<winmd::reader::StandAloneSig>,winmd::reader::table<winmd::reader::ModuleRef>,winmd::reader::table<winmd::reader::TypeSpec>,winmd::reader::table<winmd::reader::Assembly>,winmd::reader::table<winmd::reader::AssemblyRef>,winmd::reader::table<winmd::reader::File>,winmd::reader::table<winmd::reader::ExportedType>,winmd::reader::table<winmd::reader::ManifestResource>,winmd::reader::table<winmd::reader::GenericParam>,winmd::reader::table<winmd::reader::GenericParamConstraint>,winmd::reader::table<winmd::reader::MethodSpec>>
                  (table<winmd::reader::MethodDef> *tables,table<winmd::reader::Field> *tables_1,
                  table<winmd::reader::TypeRef> *tables_2,table<winmd::reader::TypeDef> *tables_3,
                  table<winmd::reader::Param> *tables_4,
                  table<winmd::reader::InterfaceImpl> *tables_5,
                  table<winmd::reader::MemberRef> *tables_6,table<winmd::reader::Module> *tables_7,
                  table<winmd::reader::Property> *tables_8,table<winmd::reader::Event> *tables_9,
                  table<winmd::reader::StandAloneSig> *tables_10,
                  table<winmd::reader::ModuleRef> *tables_11,
                  table<winmd::reader::TypeSpec> *tables_12,
                  table<winmd::reader::Assembly> *tables_13,
                  table<winmd::reader::AssemblyRef> *tables_14,table<winmd::reader::File> *tables_15
                  ,table<winmd::reader::ExportedType> *tables_16,
                  table<winmd::reader::ManifestResource> *tables_17,
                  table<winmd::reader::GenericParam> *tables_18,
                  table<winmd::reader::GenericParamConstraint> *tables_19,
                  table<winmd::reader::MethodSpec> *tables_20)

{
  return ((0x7ff < (tables_20->super_table_base).m_row_count ||
          (0x7ff < (tables_19->super_table_base).m_row_count ||
          (0x7ff < (tables_18->super_table_base).m_row_count ||
          (0x7ff < (tables_17->super_table_base).m_row_count ||
          0x7ff < (tables_16->super_table_base).m_row_count)))) ||
         ((0x7ff < (tables_15->super_table_base).m_row_count ||
          (0x7ff < (tables_14->super_table_base).m_row_count ||
          (0x7ff < (tables_13->super_table_base).m_row_count ||
          0x7ff < (tables_12->super_table_base).m_row_count))) ||
         ((0x7ff < (tables_11->super_table_base).m_row_count ||
          (0x7ff < (tables_10->super_table_base).m_row_count ||
          0x7ff < (tables_9->super_table_base).m_row_count)) ||
         ((0x7ff < (tables_8->super_table_base).m_row_count ||
          0x7ff < (tables_7->super_table_base).m_row_count) ||
         (0x7ff < (tables_6->super_table_base).m_row_count ||
         ((0x7ff < (tables_5->super_table_base).m_row_count ||
          0x7ff < (tables_4->super_table_base).m_row_count) ||
         ((0x7ff < (tables_3->super_table_base).m_row_count ||
          0x7ff < (tables_2->super_table_base).m_row_count) ||
         (0x7ff < (tables_1->super_table_base).m_row_count ||
         0x7ff < (tables->super_table_base).m_row_count)))))))) * '\x02' + '\x02';
}

Assistant:

static uint8_t composite_index_size(Tables const&... tables)
        {
            return (composite_index_size(tables.size(), impl::bits_needed(sizeof...(tables))) && ...) ? 2 : 4;
        }